

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# register_allocation.cpp
# Opt level: O2

vector<std::shared_ptr<mocker::nasm::Mov>,_std::allocator<std::shared_ptr<mocker::nasm::Mov>_>_> *
__thiscall
mocker::detail::MoveInfo::freezeMoves
          (vector<std::shared_ptr<mocker::nasm::Mov>,_std::allocator<std::shared_ptr<mocker::nasm::Mov>_>_>
           *__return_storage_ptr__,MoveInfo *this,Node *n)

{
  bool bVar1;
  _Node_iterator_base<std::shared_ptr<mocker::nasm::Mov>,_true> __it;
  MoveInfo *this_00;
  shared_ptr<mocker::nasm::Mov> *mov;
  pointer x;
  vector<std::shared_ptr<mocker::nasm::Mov>,_std::allocator<std::shared_ptr<mocker::nasm::Mov>_>_>
  movs;
  allocator_type local_49;
  vector<std::shared_ptr<mocker::nasm::Mov>,_std::allocator<std::shared_ptr<mocker::nasm::Mov>_>_>
  local_48;
  
  getCurAssociatedMoves(&local_48,this,n);
  std::vector<std::shared_ptr<mocker::nasm::Mov>,std::allocator<std::shared_ptr<mocker::nasm::Mov>>>
  ::
  vector<__gnu_cxx::__normal_iterator<std::shared_ptr<mocker::nasm::Mov>*,std::vector<std::shared_ptr<mocker::nasm::Mov>,std::allocator<std::shared_ptr<mocker::nasm::Mov>>>>,void>
            ((vector<std::shared_ptr<mocker::nasm::Mov>,std::allocator<std::shared_ptr<mocker::nasm::Mov>>>
              *)__return_storage_ptr__,
             (__normal_iterator<std::shared_ptr<mocker::nasm::Mov>_*,_std::vector<std::shared_ptr<mocker::nasm::Mov>,_std::allocator<std::shared_ptr<mocker::nasm::Mov>_>_>_>
              )local_48.
               super__Vector_base<std::shared_ptr<mocker::nasm::Mov>,_std::allocator<std::shared_ptr<mocker::nasm::Mov>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<std::shared_ptr<mocker::nasm::Mov>_*,_std::vector<std::shared_ptr<mocker::nasm::Mov>,_std::allocator<std::shared_ptr<mocker::nasm::Mov>_>_>_>
              )local_48.
               super__Vector_base<std::shared_ptr<mocker::nasm::Mov>,_std::allocator<std::shared_ptr<mocker::nasm::Mov>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,&local_49);
  for (x = local_48.
           super__Vector_base<std::shared_ptr<mocker::nasm::Mov>,_std::allocator<std::shared_ptr<mocker::nasm::Mov>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      x != local_48.
           super__Vector_base<std::shared_ptr<mocker::nasm::Mov>,_std::allocator<std::shared_ptr<mocker::nasm::Mov>_>_>
           ._M_impl.super__Vector_impl_data._M_finish; x = x + 1) {
    std::
    _Hashtable<std::shared_ptr<mocker::nasm::Mov>,std::shared_ptr<mocker::nasm::Mov>,std::allocator<std::shared_ptr<mocker::nasm::Mov>>,std::__detail::_Identity,mocker::nasm::InstPtrEqual,mocker::nasm::InstPtrHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::_M_emplace<std::shared_ptr<mocker::nasm::Mov>&>
              ((_Hashtable<std::shared_ptr<mocker::nasm::Mov>,std::shared_ptr<mocker::nasm::Mov>,std::allocator<std::shared_ptr<mocker::nasm::Mov>>,std::__detail::_Identity,mocker::nasm::InstPtrEqual,mocker::nasm::InstPtrHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)&this->frozen,x);
    bVar1 = isIn<std::unordered_set<std::shared_ptr<mocker::nasm::Mov>,mocker::nasm::InstPtrHash,mocker::nasm::InstPtrEqual,std::allocator<std::shared_ptr<mocker::nasm::Mov>>>,std::shared_ptr<mocker::nasm::Mov>>
                      (&this->active,x);
    if (bVar1) {
      __it._M_cur = (__node_type *)
                    std::
                    _Hashtable<std::shared_ptr<mocker::nasm::Mov>,_std::shared_ptr<mocker::nasm::Mov>,_std::allocator<std::shared_ptr<mocker::nasm::Mov>_>,_std::__detail::_Identity,_mocker::nasm::InstPtrEqual,_mocker::nasm::InstPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                    ::find((_Hashtable<std::shared_ptr<mocker::nasm::Mov>,_std::shared_ptr<mocker::nasm::Mov>,_std::allocator<std::shared_ptr<mocker::nasm::Mov>_>,_std::__detail::_Identity,_mocker::nasm::InstPtrEqual,_mocker::nasm::InstPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                            *)this,x);
      this_00 = this;
    }
    else {
      __it._M_cur = (__node_type *)
                    std::
                    _Hashtable<std::shared_ptr<mocker::nasm::Mov>,_std::shared_ptr<mocker::nasm::Mov>,_std::allocator<std::shared_ptr<mocker::nasm::Mov>_>,_std::__detail::_Identity,_mocker::nasm::InstPtrEqual,_mocker::nasm::InstPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                    ::find(&(this->worklist)._M_h,x);
      this_00 = (MoveInfo *)&this->worklist;
    }
    std::
    _Hashtable<std::shared_ptr<mocker::nasm::Mov>,_std::shared_ptr<mocker::nasm::Mov>,_std::allocator<std::shared_ptr<mocker::nasm::Mov>_>,_std::__detail::_Identity,_mocker::nasm::InstPtrEqual,_mocker::nasm::InstPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::erase((_Hashtable<std::shared_ptr<mocker::nasm::Mov>,_std::shared_ptr<mocker::nasm::Mov>,_std::allocator<std::shared_ptr<mocker::nasm::Mov>_>,_std::__detail::_Identity,_mocker::nasm::InstPtrEqual,_mocker::nasm::InstPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
             *)this_00,(const_iterator)__it._M_cur);
  }
  std::
  vector<std::shared_ptr<mocker::nasm::Mov>,_std::allocator<std::shared_ptr<mocker::nasm::Mov>_>_>::
  ~vector(&local_48);
  return __return_storage_ptr__;
}

Assistant:

std::vector<MovInst> MoveInfo::freezeMoves(const Node &n) {
  auto movs = getCurAssociatedMoves(n);
  std::vector<MovInst> res(movs.begin(), movs.end());

  for (auto &mov : movs) {
    frozen.emplace(mov);
    if (isIn(active, mov))
      active.erase(active.find(mov));
    else
      worklist.erase(worklist.find(mov));
  }

  return res;
}